

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O0

bool __thiscall crnlib::crn_comp::compress_internal(crn_comp *this)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  long in_RDI;
  uint i_1;
  symbol_codec codec;
  uint level;
  uint pass;
  uint i;
  vector<unsigned_char> *in_stack_fffffffffffffe98;
  uint expected_file_size;
  symbol_codec *in_stack_fffffffffffffea0;
  crn_comp *in_stack_fffffffffffffea8;
  symbol_codec *in_stack_fffffffffffffec0;
  vector<unsigned_char> *local_130;
  uint in_stack_ffffffffffffff10;
  uint in_stack_ffffffffffffff14;
  crn_comp *in_stack_ffffffffffffff18;
  uint local_cc;
  crn_comp *in_stack_ffffffffffffff78;
  vector<unsigned_short> *in_stack_ffffffffffffff80;
  vector<unsigned_short> *in_stack_ffffffffffffff88;
  symbol_codec *in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff9b;
  uint in_stack_ffffffffffffff9c;
  crn_comp *in_stack_ffffffffffffffa0;
  vector<unsigned_short> *in_stack_ffffffffffffffb0;
  vector<unsigned_short> *in_stack_ffffffffffffffb8;
  uint local_1c;
  uint local_18;
  uint local_14;
  byte local_1;
  
  bVar2 = alias_images(in_stack_ffffffffffffff18);
  if (bVar2) {
    bVar2 = quantize_images((crn_comp *)codec.m_decode_buf_size);
    if (bVar2) {
      symbol_histogram::clear((symbol_histogram *)0x1d0987);
      local_130 = in_stack_fffffffffffffe98;
      for (local_14 = 0; local_14 < 2; local_14 = local_14 + 1) {
        vector<unsigned_short>::clear((vector<unsigned_short> *)in_stack_fffffffffffffea0);
        symbol_histogram::clear((symbol_histogram *)0x1d09e4);
        static_huffman_data_model::clear((static_huffman_data_model *)in_stack_fffffffffffffea0);
        vector<unsigned_short>::clear((vector<unsigned_short> *)in_stack_fffffffffffffea0);
        symbol_histogram::clear((symbol_histogram *)0x1d0a4a);
        static_huffman_data_model::clear((static_huffman_data_model *)in_stack_fffffffffffffea0);
      }
      if ((*(byte *)(in_RDI + 0x14d0) & 1) != 0) {
        optimize_color((crn_comp *)codec.m_arith_output_buf._8_8_);
      }
      if ((*(byte *)(in_RDI + 0x14d1) & 1) != 0) {
        optimize_alpha((crn_comp *)codec.m_arith_output_buf._8_8_);
      }
      for (local_18 = 0; uVar3 = (uint)((ulong)local_130 >> 0x20), local_18 < 2;
          local_18 = local_18 + 1) {
        local_1c = 0;
        while( true ) {
          uVar3 = vector<crnlib::crn_comp::level_details>::size
                            ((vector<crnlib::crn_comp::level_details> *)(in_RDI + 0x14d8));
          expected_file_size = (uint)((ulong)local_130 >> 0x20);
          if (uVar3 <= local_1c) break;
          symbol_codec::symbol_codec(in_stack_fffffffffffffec0);
          symbol_codec::start_encoding(in_stack_fffffffffffffea0,expected_file_size);
          uVar1 = in_stack_ffffffffffffff14 & 0xffffff;
          if (local_18 == 0) {
            uVar1 = CONCAT13(local_1c != 0,(int3)in_stack_ffffffffffffff14) ^ 0xff000000;
          }
          in_stack_ffffffffffffff14 = uVar1;
          if ((*(byte *)(in_RDI + 0x14d1) & 1) == 0) {
            local_130 = (vector<unsigned_char> *)0x0;
          }
          else {
            local_130 = (vector<unsigned_char> *)(in_RDI + 0x1eb0);
          }
          if ((*(byte *)(in_RDI + 0x14d1) & 1) == 0) {
            in_stack_fffffffffffffea0 = (symbol_codec *)0x0;
          }
          else {
            in_stack_fffffffffffffea0 = (symbol_codec *)(in_RDI + 0x1f60);
          }
          in_stack_fffffffffffffec0 = in_stack_fffffffffffffea0;
          in_stack_ffffffffffffff10 = local_1c;
          bVar2 = pack_blocks(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,
                              (bool)in_stack_ffffffffffffff9b,in_stack_ffffffffffffff90,
                              in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                              in_stack_ffffffffffffffb0,in_stack_ffffffffffffffb8);
          if (bVar2) {
            symbol_codec::stop_encoding(in_stack_fffffffffffffea0,SUB81((ulong)local_130 >> 0x38,0))
            ;
            if (local_18 != 0) {
              in_stack_fffffffffffffea8 = (crn_comp *)(in_RDI + 0x2000 + (ulong)local_1c * 0x10);
              symbol_codec::get_encoding_buf((symbol_codec *)&stack0xffffffffffffff48);
              vector<unsigned_char>::swap
                        ((vector<unsigned_char> *)in_stack_fffffffffffffea0,local_130);
            }
            bVar2 = false;
          }
          else {
            local_1 = 0;
            bVar2 = true;
          }
          symbol_codec::~symbol_codec(in_stack_fffffffffffffea0);
          if (bVar2) goto LAB_001d0f8d;
          local_1c = local_1c + 1;
        }
        if (local_18 == 0) {
          static_huffman_data_model::init
                    ((static_huffman_data_model *)(in_RDI + 0x1e68),(EVP_PKEY_CTX *)0x1);
          for (local_cc = 0; local_cc < 2; local_cc = local_cc + 1) {
            uVar3 = symbol_histogram::size((symbol_histogram *)0x1d0e21);
            if (uVar3 != 0) {
              static_huffman_data_model::init
                        ((static_huffman_data_model *)(in_RDI + 0x1ee0 + (ulong)local_cc * 0x38),
                         (EVP_PKEY_CTX *)0x1);
            }
            uVar3 = symbol_histogram::size((symbol_histogram *)0x1d0e8c);
            if (uVar3 != 0) {
              static_huffman_data_model::init
                        ((static_huffman_data_model *)(in_RDI + 0x1f90 + (ulong)local_cc * 0x38),
                         (EVP_PKEY_CTX *)0x1);
            }
          }
        }
      }
      bVar2 = pack_data_models(in_stack_ffffffffffffff78);
      if (bVar2) {
        bVar2 = create_comp_data((crn_comp *)
                                 CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
        if (bVar2) {
          bVar2 = update_progress(in_stack_fffffffffffffea8,
                                  (uint)((ulong)in_stack_fffffffffffffea0 >> 0x20),
                                  (uint)in_stack_fffffffffffffea0,uVar3);
          if (bVar2) {
            if ((*(uint *)(*(long *)(in_RDI + 0x2c8) + 0x20) & 0x80000000) != 0) {
              crnlib_print_mem_stats();
            }
            local_1 = 1;
          }
          else {
            local_1 = 0;
          }
        }
        else {
          local_1 = 0;
        }
      }
      else {
        local_1 = 0;
      }
    }
    else {
      local_1 = 0;
    }
  }
  else {
    local_1 = 0;
  }
LAB_001d0f8d:
  return (bool)(local_1 & 1);
}

Assistant:

bool crn_comp::compress_internal() {
  if (!alias_images())
    return false;
  if (!quantize_images())
    return false;

  m_reference_hist.clear();
  for (uint i = 0; i < 2; i++) {
    m_endpoint_remaping[i].clear();
    m_endpoint_index_hist[i].clear();
    m_endpoint_index_dm[i].clear();
    m_selector_remaping[i].clear();
    m_selector_index_hist[i].clear();
    m_selector_index_dm[i].clear();
  }

  if (m_has_comp[cColor])
    optimize_color();

  if (m_has_comp[cAlpha0])
    optimize_alpha();

  for (uint pass = 0; pass < 2; pass++) {
    for (uint level = 0; level < m_levels.size(); level++) {
      symbol_codec codec;
      codec.start_encoding(2 * 1024 * 1024);

      if (!pack_blocks(
          level,
          !pass && !level, pass ? &codec : NULL,
          m_has_comp[cColor] ? &m_endpoint_remaping[cColor] : NULL, m_has_comp[cColor] ? &m_selector_remaping[cColor] : NULL,
          m_has_comp[cAlpha0] ? &m_endpoint_remaping[cAlpha0] : NULL, m_has_comp[cAlpha0] ? &m_selector_remaping[cAlpha0] : NULL)) {
        return false;
      }

      codec.stop_encoding(false);

      if (pass)
        m_packed_blocks[level].swap(codec.get_encoding_buf());
    }

    if (!pass) {
      m_reference_dm.init(true, m_reference_hist, 16);

      for (uint i = 0; i < 2; i++) {
        if (m_endpoint_index_hist[i].size())
          m_endpoint_index_dm[i].init(true, m_endpoint_index_hist[i], 16);

        if (m_selector_index_hist[i].size())
          m_selector_index_dm[i].init(true, m_selector_index_hist[i], 16);
      }
    }
  }

  if (!pack_data_models())
    return false;

  if (!create_comp_data())
    return false;

  if (!update_progress(24, 1, 1))
    return false;

  if (m_pParams->m_flags & cCRNCompFlagDebugging) {
    crnlib_print_mem_stats();
  }

  return true;
}